

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O0

string * compose_owerflow_err_msg_abi_cxx11_(string *__return_storage_ptr__,double d)

{
  ostream *poVar1;
  char *pcVar2;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  double local_18;
  double d_local;
  
  local_18 = d;
  d_local = (double)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"integer ");
  pcVar2 = "underflow";
  if (2147483647.0 < local_18) {
    pcVar2 = "owerflow";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,". Calculator can work with integers in range [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,-0x80000000);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x7fffffff);
  std::operator<<(poVar1,']');
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string compose_owerflow_err_msg(double d)
{
	stringstream ss;
	ss << "integer "
		<< (d > INT32_MAX ? "owerflow" : "underflow")
		<< ". Calculator can work with integers in range ["
		<< INT32_MIN
		<< ", "
		<< INT32_MAX
		<< ']';
	return ss.str();
}